

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3Fts3Dequote(char *z)

{
  byte bVar1;
  ulong uVar2;
  int iVar3;
  byte bVar4;
  long lVar5;
  
  bVar4 = *z;
  if ((bVar4 - 0x22 < 0x3f) && ((0x4200000000000021U >> ((ulong)(bVar4 - 0x22) & 0x3f) & 1) != 0)) {
    bVar1 = 0x5d;
    if (bVar4 != 0x5b) {
      bVar1 = bVar4;
    }
    bVar4 = z[1];
    if (bVar4 == 0) {
      uVar2 = 0;
    }
    else {
      iVar3 = 1;
      lVar5 = 1;
      uVar2 = 0;
      do {
        if (bVar4 == bVar1) {
          if (z[lVar5 + 1] != bVar1) break;
          z[uVar2] = bVar1;
          iVar3 = iVar3 + 2;
        }
        else {
          iVar3 = iVar3 + 1;
          z[uVar2] = bVar4;
        }
        uVar2 = uVar2 + 1;
        lVar5 = (long)iVar3;
        bVar4 = z[lVar5];
      } while (bVar4 != 0);
      uVar2 = uVar2 & 0xffffffff;
    }
    z[uVar2] = '\0';
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3Fts3Dequote(char *z){
  char quote;                     /* Quote character (if any ) */

  quote = z[0];
  if( quote=='[' || quote=='\'' || quote=='"' || quote=='`' ){
    int iIn = 1;                  /* Index of next byte to read from input */
    int iOut = 0;                 /* Index of next byte to write to output */

    /* If the first byte was a '[', then the close-quote character is a ']' */
    if( quote=='[' ) quote = ']';  

    while( z[iIn] ){
      if( z[iIn]==quote ){
        if( z[iIn+1]!=quote ) break;
        z[iOut++] = quote;
        iIn += 2;
      }else{
        z[iOut++] = z[iIn++];
      }
    }
    z[iOut] = '\0';
  }
}